

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleQueue.hpp
# Opt level: O2

void __thiscall
gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::~SimpleQueue
          (SimpleQueue<helics::ActionMessage,_std::mutex> *this)

{
  CLI::std::mutex::lock((mutex *)&this->m_pullLock);
  CLI::std::mutex::lock((mutex *)this);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
            (&this->pushElements);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
            (&this->pullElements);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_pullLock);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::~vector
            (&this->pullElements);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::~vector
            (&this->pushElements);
  return;
}

Assistant:

~SimpleQueue()
        {
            // these locks are primarily for memory synchronization multiple
            // access in the destructor would be a bad thing
            std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
            std::lock_guard<MUTEX> pushLock(m_pushLock);  // second pushLock
            /** clear the elements as part of the destruction while the locks
             * are engaged*/
            pushElements.clear();
            pullElements.clear();
        }